

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O1

int vpx_rac_get_prob_branchy(VpxRangeCoder *c,int prob)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = vpx_rac_renorm(c);
  iVar2 = ((c->high + -1) * prob >> 8) + 1;
  bVar4 = (uint)(iVar2 * 0x10000) <= uVar1;
  uVar3 = uVar1 + iVar2 * -0x10000;
  if (bVar4) {
    c->high = c->high - iVar2;
  }
  else {
    c->high = iVar2;
    uVar3 = uVar1;
  }
  c->code_word = uVar3;
  return (uint)bVar4;
}

Assistant:

int vpx_rac_get_prob_branchy(VpxRangeCoder *c, int prob)
{
    unsigned long code_word = vpx_rac_renorm(c);
    unsigned low = 1 + (((c->high - 1) * prob) >> 8);
    unsigned low_shift = low << 16;

    if (code_word >= low_shift) {
        c->high     -= low;
        c->code_word = code_word - low_shift;
        return 1;
    }

    c->high = low;
    c->code_word = code_word;
    return 0;
}